

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O2

void Rml::PluginRegistry::NotifyShutdown(void)

{
  Plugin *plugin;
  PluginVectors *pPVar1;
  
  while( true ) {
    pPVar1 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    if ((pPVar1->basic).super__Vector_base<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (pPVar1->basic).super__Vector_base<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>._M_impl.
        super__Vector_impl_data._M_finish) break;
    pPVar1 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    plugin = (pPVar1->basic).super__Vector_base<Rml::Plugin_*,_std::allocator<Rml::Plugin_*>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1];
    UnregisterPlugin(plugin);
    (*plugin->_vptr_Plugin[4])(plugin);
  }
  ControlledLifetimeResource<Rml::PluginVectors>::Shutdown
            ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
  return;
}

Assistant:

void PluginRegistry::NotifyShutdown()
{
	while (!plugin_vectors->basic.empty())
	{
		Plugin* plugin = plugin_vectors->basic.back();
		PluginRegistry::UnregisterPlugin(plugin);
		plugin->OnShutdown();
	}

	plugin_vectors.Shutdown();
}